

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuslistener.cpp
# Opt level: O2

optional<QDBusListener::ChangeSignal> __thiscall
QDBusListener::findSignal(QDBusListener *this,QString *location,QString *key)

{
  undefined8 extraout_RDX;
  long in_FS_OFFSET;
  const_iterator cVar1;
  optional<QDBusListener::ChangeSignal> oVar2;
  DBusKey local_68;
  _Storage<QDBusListener::ChangeSignal,_true> local_30;
  undefined4 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.key.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.key.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.location.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.key.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.location.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.location.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  DBusKey::DBusKey(&local_68,location,key);
  local_30 = (_Storage<QDBusListener::ChangeSignal,_true>)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaa00;
  cVar1 = QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
          ::find(&this->m_signalMap,&local_68);
  if ((cVar1.c != &(this->m_signalMap).c) || (cVar1.i != (this->m_signalMap).c.keys.d.size)) {
    std::optional<QDBusListener::ChangeSignal>::emplace<QDBusListener::ChangeSignal_const&>
              ((optional<QDBusListener::ChangeSignal> *)&local_30._M_value,
               ((cVar1.c)->values).d.ptr + cVar1.i);
  }
  DBusKey::~DBusKey(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    oVar2.super__Optional_base<QDBusListener::ChangeSignal,_true,_true>._M_payload.
    super__Optional_payload_base<QDBusListener::ChangeSignal>._8_4_ =
         (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),(undefined1)local_28);
    oVar2.super__Optional_base<QDBusListener::ChangeSignal,_true,_true>._M_payload.
    super__Optional_payload_base<QDBusListener::ChangeSignal>._M_payload = local_30;
    return (optional<QDBusListener::ChangeSignal>)
           oVar2.super__Optional_base<QDBusListener::ChangeSignal,_true,_true>._M_payload.
           super__Optional_payload_base<QDBusListener::ChangeSignal>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<QDBusListener::ChangeSignal>
    QDBusListener::findSignal(const QString &location, const QString &key) const
{
    const DBusKey dkey(location, key);
    std::optional<QDBusListener::ChangeSignal> ret;
    const auto it = m_signalMap.find(dkey);
    if (it != m_signalMap.cend())
        ret.emplace(it.value());

    return ret;
}